

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O3

void __thiscall wasm::DataFlow::Printer::printInternal(Printer *this,Node *node)

{
  iterator iVar1;
  key_type *ppNVar2;
  Node *local_40;
  Literal local_38;
  key_type local_20;
  
  local_40 = node;
  iVar1 = std::
          _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->trace->replacements)._M_h,&local_40);
  ppNVar2 = (key_type *)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
                   ._M_cur + 0x10);
  if (iVar1.
      super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    ppNVar2 = &local_40;
  }
  local_20 = *ppNVar2;
  if (local_20 != (key_type)0x0) {
    if ((local_20->type == Expr) && (((local_20->field_1).expr)->_id == ConstId)) {
      Literal::Literal(&local_38,(Literal *)((local_20->field_1).expr + 1));
      print(this,&local_38);
      Literal::~Literal(&local_38);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_20);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                ,0x20e,"void wasm::DataFlow::Printer::printInternal(Node *)");
}

Assistant:

void printInternal(Node* node) {
    node = getMaybeReplaced(node);
    assert(node);
    if (node->isConst()) {
      print(node->expr->cast<Const>()->value);
    } else {
      std::cout << "%" << indexing[node];
    }
  }